

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mapi.c
# Opt level: O3

void luaM_metrics(lua_State *L,luam_Metrics *metrics)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  sVar1 = *(size_t *)(uVar2 + 0x38);
  metrics->strhash_hit = *(size_t *)(uVar2 + 0x30);
  metrics->strhash_miss = sVar1;
  metrics->gc_strnum = (ulong)*(uint *)(uVar2 + 0xc);
  sVar1 = *(size_t *)(uVar2 + 0xd8);
  metrics->gc_tabnum = *(size_t *)(uVar2 + 0xd0);
  metrics->gc_udatanum = sVar1;
  metrics->gc_cdatanum = *(size_t *)(uVar2 + 0xe0);
  metrics->gc_total = (ulong)*(uint *)(uVar2 + 0x50);
  sVar1 = *(size_t *)(uVar2 + 0x98);
  metrics->gc_freed = *(size_t *)(uVar2 + 0x90);
  metrics->gc_allocated = sVar1;
  metrics->gc_steps_pause = *(size_t *)(uVar2 + 0xa0);
  metrics->gc_steps_propagate = *(size_t *)(uVar2 + 0xa8);
  metrics->gc_steps_atomic = *(size_t *)(uVar2 + 0xb0);
  metrics->gc_steps_sweepstring = *(size_t *)(uVar2 + 0xb8);
  metrics->gc_steps_sweep = *(size_t *)(uVar2 + 0xc0);
  metrics->gc_steps_finalize = *(size_t *)(uVar2 + 200);
  sVar1 = *(size_t *)(uVar2 + 0xc48);
  metrics->jit_snap_restore = *(size_t *)(uVar2 + 0xc40);
  metrics->jit_trace_abort = sVar1;
  metrics->jit_mcode_size = *(size_t *)(uVar2 + 0xc30);
  metrics->jit_trace_num = *(uint *)(uVar2 + 0xc38);
  return;
}

Assistant:

LUAMISC_API void luaM_metrics(lua_State *L, struct luam_Metrics *metrics)
{
  global_State *g = G(L);
  GCState *gc = &g->gc;
#if LJ_HASJIT
  jit_State *J = G2J(g);
#endif

  lj_assertL(metrics != NULL, "uninitialized metrics struct");

  metrics->strhash_hit = g->strhash_hit;
  metrics->strhash_miss = g->strhash_miss;

  metrics->gc_strnum = g->strnum;
  metrics->gc_tabnum = gc->tabnum;
  metrics->gc_udatanum = gc->udatanum;
#if LJ_HASFFI
  metrics->gc_cdatanum = gc->cdatanum;
#else
  metrics->gc_cdatanum = 0;
#endif

  metrics->gc_total = gc->total;
  metrics->gc_freed = gc->freed;
  metrics->gc_allocated = gc->allocated;

  metrics->gc_steps_pause = gc->state_count[GCSpause];
  metrics->gc_steps_propagate = gc->state_count[GCSpropagate];
  metrics->gc_steps_atomic = gc->state_count[GCSatomic];
  metrics->gc_steps_sweepstring = gc->state_count[GCSsweepstring];
  metrics->gc_steps_sweep = gc->state_count[GCSsweep];
  metrics->gc_steps_finalize = gc->state_count[GCSfinalize];

#if LJ_HASJIT
  metrics->jit_snap_restore = J->nsnaprestore;
  metrics->jit_trace_abort = J->ntraceabort;
  metrics->jit_mcode_size = J->szallmcarea;
  metrics->jit_trace_num = J->tracenum;
#else
  metrics->jit_snap_restore = 0;
  metrics->jit_trace_abort = 0;
  metrics->jit_mcode_size = 0;
  metrics->jit_trace_num = 0;
#endif
}